

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u8 minMaxQuery(AggInfo *pAggInfo,ExprList **ppMinMax)

{
  Expr *pEVar1;
  ExprList *pEVar2;
  u8 uVar3;
  char *pcVar4;
  byte bVar5;
  byte *pbVar6;
  byte bVar7;
  byte *pbVar8;
  
  *ppMinMax = (ExprList *)0x0;
  if (pAggInfo->nFunc != 1) {
    return '\0';
  }
  pEVar1 = pAggInfo->aFunc->pExpr;
  pEVar2 = (pEVar1->x).pList;
  if (((pEVar2 == (ExprList *)0x0) || (pEVar2->nExpr != 1)) || (pEVar2->a->pExpr->op != 0x9a)) {
LAB_00164f79:
    uVar3 = '\0';
  }
  else {
    pbVar6 = (byte *)(pEVar1->u).zToken;
    bVar5 = *pbVar6;
    bVar7 = bVar5;
    if (bVar5 == 0) {
      pcVar4 = "min";
    }
    else {
      pcVar4 = "min";
      pbVar8 = pbVar6;
      do {
        pbVar8 = pbVar8 + 1;
        if (""[bVar7] != ""[(byte)*pcVar4]) break;
        pcVar4 = (char *)((byte *)pcVar4 + 1);
        bVar7 = *pbVar8;
      } while (bVar7 != 0);
    }
    uVar3 = '\x01';
    if (""[bVar7] != ""[(byte)*pcVar4]) {
      if (bVar5 == 0) {
        pcVar4 = "max";
      }
      else {
        pcVar4 = "max";
        do {
          pbVar6 = pbVar6 + 1;
          if (""[bVar5] != ""[(byte)*pcVar4]) break;
          pcVar4 = (char *)((byte *)pcVar4 + 1);
          bVar5 = *pbVar6;
        } while (bVar5 != 0);
      }
      uVar3 = '\x02';
      if (""[bVar5] != ""[(byte)*pcVar4]) goto LAB_00164f79;
    }
    *ppMinMax = pEVar2;
  }
  return uVar3;
}

Assistant:

static u8 minMaxQuery(AggInfo *pAggInfo, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;          /* Return value */

  *ppMinMax = 0;
  if( pAggInfo->nFunc==1 ){
    Expr *pExpr = pAggInfo->aFunc[0].pExpr; /* Aggregate function */
    ExprList *pEList = pExpr->x.pList;      /* Arguments to agg function */

    assert( pExpr->op==TK_AGG_FUNCTION );
    if( pEList && pEList->nExpr==1 && pEList->a[0].pExpr->op==TK_AGG_COLUMN ){
      const char *zFunc = pExpr->u.zToken;
      if( sqlite3StrICmp(zFunc, "min")==0 ){
        eRet = WHERE_ORDERBY_MIN;
        *ppMinMax = pEList;
      }else if( sqlite3StrICmp(zFunc, "max")==0 ){
        eRet = WHERE_ORDERBY_MAX;
        *ppMinMax = pEList;
      }
    }
  }

  assert( *ppMinMax==0 || (*ppMinMax)->nExpr==1 );
  return eRet;
}